

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ColumnData::ScanVector
          (ColumnData *this,ColumnScanState *state,Vector *result,idx_t remaining,
          ScanVectorType scan_type,idx_t base_result_offset)

{
  ColumnSegment *pCVar1;
  ulong uVar2;
  TableScanOptions *pTVar3;
  InternalException *this_00;
  idx_t iVar4;
  ulong scan_count;
  idx_t iVar5;
  allocator local_c1;
  Vector *local_c0;
  ScanVectorType local_b4;
  idx_t local_b0;
  idx_t local_a8;
  optional_ptr<duckdb::TableScanOptions,_true> *local_a0;
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
  *local_98;
  vector<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>,std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>>>
  *local_90;
  ulong local_88;
  ColumnFetchState fetch_state;
  
  local_c0 = result;
  local_b4 = scan_type;
  local_b0 = base_result_offset;
  if ((scan_type == SCAN_FLAT_VECTOR) && (result->vector_type != FLAT_VECTOR)) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&fetch_state,
               "ScanVector called with SCAN_FLAT_VECTOR but result is not a flat vector",&local_c1);
    InternalException::InternalException(this_00,(string *)&fetch_state);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  BeginScanVectorInternal(this,state);
  local_b0 = local_b0 + remaining;
  local_a0 = &state->scan_options;
  local_90 = (vector<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>,std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>>>
              *)&state->previous_states;
  local_98 = &state->scan_state;
  local_a8 = remaining;
LAB_0154020c:
  if (remaining != 0) {
    iVar4 = (state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i +
            (state->current->super_SegmentBase<duckdb::ColumnSegment>).start;
    scan_count = iVar4 - state->row_index;
    if (remaining < scan_count) {
      scan_count = remaining;
    }
    uVar2 = remaining;
    if (iVar4 != state->row_index) goto LAB_0154023d;
    goto LAB_015402fc;
  }
  remaining = 0;
LAB_01540335:
  state->internal_index = state->row_index;
  return local_a8 - remaining;
LAB_0154023d:
  iVar4 = local_b0 - remaining;
  local_88 = remaining;
  if ((local_a0->ptr == (TableScanOptions *)0x0) ||
     (pTVar3 = optional_ptr<duckdb::TableScanOptions,_true>::operator->(local_a0),
     pTVar3->force_fetch_row != true)) {
    ColumnSegment::Scan(state->current,state,scan_count,local_c0,iVar4,local_b4);
  }
  else {
    for (iVar5 = 0; scan_count != iVar5; iVar5 = iVar5 + 1) {
      fetch_state.handles._M_h._M_bucket_count = 1;
      fetch_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      fetch_state.handles._M_h._M_element_count = 0;
      fetch_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      fetch_state.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fetch_state.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fetch_state.child_states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fetch_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
      fetch_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pCVar1 = state->current;
      fetch_state.handles._M_h._M_buckets = &fetch_state.handles._M_h._M_single_bucket;
      (*((pCVar1->function)._M_data)->fetch_row)
                (pCVar1,&fetch_state,
                 (state->row_index - (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start) +
                 iVar5,local_c0,iVar5 + iVar4);
      ColumnFetchState::~ColumnFetchState(&fetch_state);
    }
  }
  state->row_index = state->row_index + scan_count;
  remaining = 0;
  uVar2 = local_88 - scan_count;
  if (local_88 - scan_count != 0) {
LAB_015402fc:
    remaining = uVar2;
    pCVar1 = (state->current->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
    if (pCVar1 == (ColumnSegment *)0x0) goto LAB_01540335;
    ::std::
    vector<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>,std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>>
              (local_90,local_98);
    state->current = pCVar1;
    ColumnSegment::InitializeScan(pCVar1,state);
    state->segment_checked = false;
  }
  goto LAB_0154020c;
}

Assistant:

idx_t ColumnData::ScanVector(ColumnScanState &state, Vector &result, idx_t remaining, ScanVectorType scan_type,
                             idx_t base_result_offset) {
	if (scan_type == ScanVectorType::SCAN_FLAT_VECTOR && result.GetVectorType() != VectorType::FLAT_VECTOR) {
		throw InternalException("ScanVector called with SCAN_FLAT_VECTOR but result is not a flat vector");
	}
	BeginScanVectorInternal(state);
	idx_t initial_remaining = remaining;
	while (remaining > 0) {
		D_ASSERT(state.row_index >= state.current->start &&
		         state.row_index <= state.current->start + state.current->count);
		idx_t scan_count = MinValue<idx_t>(remaining, state.current->start + state.current->count - state.row_index);
		idx_t result_offset = base_result_offset + initial_remaining - remaining;
		if (scan_count > 0) {
			if (state.scan_options && state.scan_options->force_fetch_row) {
				for (idx_t i = 0; i < scan_count; i++) {
					ColumnFetchState fetch_state;
					state.current->FetchRow(fetch_state, UnsafeNumericCast<row_t>(state.row_index + i), result,
					                        result_offset + i);
				}
			} else {
				state.current->Scan(state, scan_count, result, result_offset, scan_type);
			}

			state.row_index += scan_count;
			remaining -= scan_count;
		}

		if (remaining > 0) {
			auto next = data.GetNextSegment(state.current);
			if (!next) {
				break;
			}
			state.previous_states.emplace_back(std::move(state.scan_state));
			state.current = next;
			state.current->InitializeScan(state);
			state.segment_checked = false;
			D_ASSERT(state.row_index >= state.current->start &&
			         state.row_index <= state.current->start + state.current->count);
		}
	}
	state.internal_index = state.row_index;
	return initial_remaining - remaining;
}